

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpServer.h
# Opt level: O1

void __thiscall TcpServer::daemonRun(TcpServer *this)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  pair<const_int,_std::deque<WriteMeta,_std::allocator<WriteMeta>_>_> *__args;
  _Rb_tree_header *p_Var3;
  _Rb_tree_header *p_Var4;
  uint32_t *puVar5;
  int iVar6;
  _Base_ptr p_Var7;
  _Base_ptr p_Var8;
  long lVar9;
  _Base_ptr p_Var10;
  _Rb_tree<int,std::pair<int_const,std::deque<WriteMeta,std::allocator<WriteMeta>>>,std::_Select1st<std::pair<int_const,std::deque<WriteMeta,std::allocator<WriteMeta>>>>,std::less<int>,std::allocator<std::pair<int_const,std::deque<WriteMeta,std::allocator<WriteMeta>>>>>
  *p_Var11;
  mapped_type *this_00;
  bool bVar12;
  uint uVar13;
  WriteContentResult WVar14;
  mapped_type *__events;
  char *__args_1;
  unsigned_long __args_2;
  mapped_type *pmVar15;
  int *piVar16;
  _Base_ptr p_Var17;
  const_iterator cVar18;
  undefined8 uVar19;
  _Base_ptr p_Var20;
  _Base_ptr p_Var21;
  _Rb_tree_header *p_Var22;
  ulong uVar23;
  const_iterator cVar24;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_std::deque<WriteMeta,_std::allocator<WriteMeta>_>_>_>,_std::_Rb_tree_iterator<std::pair<const_int,_std::deque<WriteMeta,_std::allocator<WriteMeta>_>_>_>_>
  pVar25;
  undefined1 local_80 [32];
  _Rb_tree<int,std::pair<int_const,std::deque<WriteMeta,std::allocator<WriteMeta>>>,std::_Select1st<std::pair<int_const,std::deque<WriteMeta,std::allocator<WriteMeta>>>>,std::less<int>,std::allocator<std::pair<int_const,std::deque<WriteMeta,std::allocator<WriteMeta>>>>>
  *local_60;
  _Rb_tree<int,std::pair<int_const,std::deque<WriteMeta,std::allocator<WriteMeta>>>,std::_Select1st<std::pair<int_const,std::deque<WriteMeta,std::allocator<WriteMeta>>>>,std::less<int>,std::allocator<std::pair<int_const,std::deque<WriteMeta,std::allocator<WriteMeta>>>>>
  *local_58;
  string *local_50;
  mapped_type *local_48;
  void *local_40;
  int local_34 [2];
  int fd;
  
  __events = (mapped_type *)operator_new__(0x3000);
  local_60 = (_Rb_tree<int,std::pair<int_const,std::deque<WriteMeta,std::allocator<WriteMeta>>>,std::_Select1st<std::pair<int_const,std::deque<WriteMeta,std::allocator<WriteMeta>>>>,std::less<int>,std::allocator<std::pair<int_const,std::deque<WriteMeta,std::allocator<WriteMeta>>>>>
              *)&this->toWriteContents;
  local_48 = (mapped_type *)&this->connections;
  p_Var1 = &(this->connections)._M_t._M_impl.super__Rb_tree_header;
  local_58 = (_Rb_tree<int,std::pair<int_const,std::deque<WriteMeta,std::allocator<WriteMeta>>>,std::_Select1st<std::pair<int_const,std::deque<WriteMeta,std::allocator<WriteMeta>>>>,std::less<int>,std::allocator<std::pair<int_const,std::deque<WriteMeta,std::allocator<WriteMeta>>>>>
              *)&this->inActiveWriteContents;
  local_50 = &this->errorString;
  p_Var3 = &(this->inActiveWriteContents)._M_t._M_impl.super__Rb_tree_header;
  p_Var2 = &(this->toWriteContents)._M_t._M_impl.super__Rb_tree_header;
  p_Var4 = &(this->closeWhenWriteFinish)._M_t._M_impl.super__Rb_tree_header;
  do {
    do {
      while( true ) {
        uVar13 = epoll_wait(this->epollFd,(epoll_event *)__events,0x400,
                            -(uint)((this->toWriteContents)._M_t._M_impl.super__Rb_tree_header.
                                    _M_node_count == 0));
        if (-1 < (int)uVar13) break;
        recordError(this,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zhangke96[P]TcpServer/TcpServer/TcpServer.h"
                    ,0x230);
        Logger::printLog(&logger,LOG_ERROR,local_50,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/zhangke96[P]TcpServer/TcpServer/TcpServer.h"
                         ,0x231);
      }
      if (uVar13 != 0) {
        uVar23 = 0;
        do {
          puVar5 = (uint32_t *)(&__events->fd + uVar23 * 3);
          printEvent(this,*(int *)((__events->address).sin_zero + uVar23 * 0xc + -8),
                     (&__events->fd)[uVar23 * 3]);
          iVar6 = *(int *)((__events->address).sin_zero + uVar23 * 0xc + -8);
          if (iVar6 == this->serverFd) {
            if (((*puVar5 & 1) != 0) && (bVar12 = acceptNewConnection(this), !bVar12)) {
              recordError(this,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zhangke96[P]TcpServer/TcpServer/TcpServer.h"
                          ,0x239);
              Logger::printLog(&logger,LOG_ERROR,local_50,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/zhangke96[P]TcpServer/TcpServer/TcpServer.h"
                               ,0x23a);
            }
          }
          else if (iVar6 == this->pipeFds[0]) {
            if ((*puVar5 & 1) != 0) {
              handleNotify(this);
            }
          }
          else {
            p_Var21 = (this->connections)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
            p_Var17 = &p_Var1->_M_header;
            for (; (_Rb_tree_header *)p_Var21 != (_Rb_tree_header *)0x0;
                p_Var21 = (&p_Var21->_M_left)[(int)*(size_t *)(p_Var21 + 1) < iVar6]) {
              if (iVar6 <= (int)*(size_t *)(p_Var21 + 1)) {
                p_Var17 = p_Var21;
              }
            }
            p_Var22 = p_Var1;
            if (((_Rb_tree_header *)p_Var17 != p_Var1) &&
               (p_Var22 = (_Rb_tree_header *)p_Var17,
               iVar6 < (int)((_Rb_tree_header *)p_Var17)->_M_node_count)) {
              p_Var22 = p_Var1;
            }
            local_34[0] = iVar6;
            if (p_Var22 == p_Var1) {
              local_80._0_8_ = (mapped_type *)(local_80 + 0x10);
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_80,"fd not seen before","");
              Logger::printLog(&logger,LOG_ERROR,(string *)local_80,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/zhangke96[P]TcpServer/TcpServer/TcpServer.h"
                               ,0x246);
              if ((mapped_type *)local_80._0_8_ != (mapped_type *)(local_80 + 0x10)) {
                operator_delete((void *)local_80._0_8_,local_80._16_8_ + 1);
              }
            }
            else {
              pmVar15 = __events;
              if ((*puVar5 & 0x11) == 0) {
                if ((*puVar5 & 4) != 0) {
                  p_Var21 = (this->inActiveWriteContents)._M_t._M_impl.super__Rb_tree_header.
                            _M_header._M_parent;
                  p_Var20 = &p_Var3->_M_header;
                  for (; (_Rb_tree_header *)p_Var21 != (_Rb_tree_header *)0x0;
                      p_Var21 = (&p_Var21->_M_left)[(int)*(size_t *)(p_Var21 + 1) < iVar6]) {
                    if (iVar6 <= (int)*(size_t *)(p_Var21 + 1)) {
                      p_Var20 = p_Var21;
                    }
                  }
                  cVar24._M_node = &p_Var3->_M_header;
                  if (((_Rb_tree_header *)p_Var20 != p_Var3) &&
                     (cVar24._M_node = p_Var20, iVar6 < (int)p_Var20[1]._M_color)) {
                    cVar24._M_node = &p_Var3->_M_header;
                  }
                  if ((_Rb_tree_header *)cVar24._M_node != p_Var3) {
                    std::
                    _Rb_tree<int,std::pair<int_const,std::deque<WriteMeta,std::allocator<WriteMeta>>>,std::_Select1st<std::pair<int_const,std::deque<WriteMeta,std::allocator<WriteMeta>>>>,std::less<int>,std::allocator<std::pair<int_const,std::deque<WriteMeta,std::allocator<WriteMeta>>>>>
                    ::
                    _M_emplace_unique<std::pair<int_const,std::deque<WriteMeta,std::allocator<WriteMeta>>>&>
                              (local_60,(pair<const_int,_std::deque<WriteMeta,_std::allocator<WriteMeta>_>_>
                                         *)(cVar24._M_node + 1));
                    std::
                    _Rb_tree<int,_std::pair<const_int,_std::deque<WriteMeta,_std::allocator<WriteMeta>_>_>,_std::_Select1st<std::pair<const_int,_std::deque<WriteMeta,_std::allocator<WriteMeta>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::deque<WriteMeta,_std::allocator<WriteMeta>_>_>_>_>
                    ::_M_erase_aux((_Rb_tree<int,_std::pair<const_int,_std::deque<WriteMeta,_std::allocator<WriteMeta>_>_>,_std::_Select1st<std::pair<const_int,_std::deque<WriteMeta,_std::allocator<WriteMeta>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::deque<WriteMeta,_std::allocator<WriteMeta>_>_>_>_>
                                    *)local_58,cVar24);
                    local_80._0_8_ =
                         std::
                         map<int,_TcpConnection,_std::less<int>,_std::allocator<std::pair<const_int,_TcpConnection>_>_>
                         ::operator[]((map<int,_TcpConnection,_std::less<int>,_std::allocator<std::pair<const_int,_TcpConnection>_>_>
                                       *)local_48,local_34);
                    local_40 = this->data;
                    if ((this->onCanWriteHandler).super__Function_base._M_manager ==
                        (_Manager_type)0x0) goto LAB_00105895;
                    (*(this->onCanWriteHandler)._M_invoker)
                              ((_Any_data *)&this->onCanWriteHandler,(TcpConnection **)local_80,
                               &local_40);
                  }
                }
              }
              else {
                __args_1 = (char *)operator_new__(0x14000);
                while (__args_2 = read(local_34[0],__args_1,0x14000), this_00 = local_48,
                      0 < (long)__args_2) {
                  if ((this->onReadHandler).super__Function_base._M_manager != (_Manager_type)0x0) {
                    std::
                    map<int,_TcpConnection,_std::less<int>,_std::allocator<std::pair<const_int,_TcpConnection>_>_>
                    ::operator[]((map<int,_TcpConnection,_std::less<int>,_std::allocator<std::pair<const_int,_TcpConnection>_>_>
                                  *)local_48,local_34);
                    pmVar15 = std::
                              map<int,_TcpConnection,_std::less<int>,_std::allocator<std::pair<const_int,_TcpConnection>_>_>
                              ::operator[]((map<int,_TcpConnection,_std::less<int>,_std::allocator<std::pair<const_int,_TcpConnection>_>_>
                                            *)this_00,local_34);
                    std::function<void_(const_TcpConnection_*,_const_char_*,_unsigned_long,_void_*)>
                    ::operator()(&this->onReadHandler,pmVar15,__args_1,__args_2,this->data);
                    pmVar15 = this_00;
                  }
                }
                if ((long)__args_2 < 0) {
                  piVar16 = __errno_location();
                  if (*piVar16 != 0xb) {
                    recordError(this,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/zhangke96[P]TcpServer/TcpServer/TcpServer.h"
                                ,600);
                    Logger::printLog(&logger,LOG_ERROR,local_50,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/zhangke96[P]TcpServer/TcpServer/TcpServer.h"
                                     ,0x259);
                  }
                }
                else {
                  if ((this->onPeerShutdownHandler).super__Function_base._M_manager !=
                      (_Manager_type)0x0) {
                    local_80._0_8_ =
                         std::
                         map<int,_TcpConnection,_std::less<int>,_std::allocator<std::pair<const_int,_TcpConnection>_>_>
                         ::operator[]((map<int,_TcpConnection,_std::less<int>,_std::allocator<std::pair<const_int,_TcpConnection>_>_>
                                       *)local_48,local_34);
                    local_40 = this->data;
                    if ((this->onPeerShutdownHandler).super__Function_base._M_manager ==
                        (_Manager_type)0x0) goto LAB_00105895;
                    (*(this->onPeerShutdownHandler)._M_invoker)
                              ((_Any_data *)&this->onPeerShutdownHandler,(TcpConnection **)local_80,
                               &local_40);
                  }
                  p_Var11 = local_60;
                  pVar25 = std::
                           _Rb_tree<int,_std::pair<const_int,_std::deque<WriteMeta,_std::allocator<WriteMeta>_>_>,_std::_Select1st<std::pair<const_int,_std::deque<WriteMeta,_std::allocator<WriteMeta>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::deque<WriteMeta,_std::allocator<WriteMeta>_>_>_>_>
                           ::equal_range((_Rb_tree<int,_std::pair<const_int,_std::deque<WriteMeta,_std::allocator<WriteMeta>_>_>,_std::_Select1st<std::pair<const_int,_std::deque<WriteMeta,_std::allocator<WriteMeta>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::deque<WriteMeta,_std::allocator<WriteMeta>_>_>_>_>
                                          *)local_60,local_34);
                  std::
                  _Rb_tree<int,_std::pair<const_int,_std::deque<WriteMeta,_std::allocator<WriteMeta>_>_>,_std::_Select1st<std::pair<const_int,_std::deque<WriteMeta,_std::allocator<WriteMeta>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::deque<WriteMeta,_std::allocator<WriteMeta>_>_>_>_>
                  ::_M_erase_aux((_Rb_tree<int,_std::pair<const_int,_std::deque<WriteMeta,_std::allocator<WriteMeta>_>_>,_std::_Select1st<std::pair<const_int,_std::deque<WriteMeta,_std::allocator<WriteMeta>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::deque<WriteMeta,_std::allocator<WriteMeta>_>_>_>_>
                                  *)p_Var11,(_Base_ptr)pVar25.first._M_node,
                                 (_Base_ptr)pVar25.second._M_node);
                  p_Var11 = local_58;
                  pVar25 = std::
                           _Rb_tree<int,_std::pair<const_int,_std::deque<WriteMeta,_std::allocator<WriteMeta>_>_>,_std::_Select1st<std::pair<const_int,_std::deque<WriteMeta,_std::allocator<WriteMeta>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::deque<WriteMeta,_std::allocator<WriteMeta>_>_>_>_>
                           ::equal_range((_Rb_tree<int,_std::pair<const_int,_std::deque<WriteMeta,_std::allocator<WriteMeta>_>_>,_std::_Select1st<std::pair<const_int,_std::deque<WriteMeta,_std::allocator<WriteMeta>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::deque<WriteMeta,_std::allocator<WriteMeta>_>_>_>_>
                                          *)local_58,local_34);
                  std::
                  _Rb_tree<int,_std::pair<const_int,_std::deque<WriteMeta,_std::allocator<WriteMeta>_>_>,_std::_Select1st<std::pair<const_int,_std::deque<WriteMeta,_std::allocator<WriteMeta>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::deque<WriteMeta,_std::allocator<WriteMeta>_>_>_>_>
                  ::_M_erase_aux((_Rb_tree<int,_std::pair<const_int,_std::deque<WriteMeta,_std::allocator<WriteMeta>_>_>,_std::_Select1st<std::pair<const_int,_std::deque<WriteMeta,_std::allocator<WriteMeta>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::deque<WriteMeta,_std::allocator<WriteMeta>_>_>_>_>
                                  *)p_Var11,(_Base_ptr)pVar25.first._M_node,
                                 (_Base_ptr)pVar25.second._M_node);
                }
                operator_delete__(__args_1);
              }
            }
          }
          uVar23 = uVar23 + 1;
        } while (uVar23 != uVar13);
      }
      cVar24._M_node = (this->toWriteContents)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    } while ((_Rb_tree_header *)cVar24._M_node == p_Var2);
    do {
      __args = (pair<const_int,_std::deque<WriteMeta,_std::allocator<WriteMeta>_>_> *)
               (cVar24._M_node + 1);
      WVar14 = writeContent(this,cVar24._M_node[1]._M_color);
      if (WVar14 == Move_to_Inactive) {
        std::
        _Rb_tree<int,std::pair<int_const,std::deque<WriteMeta,std::allocator<WriteMeta>>>,std::_Select1st<std::pair<int_const,std::deque<WriteMeta,std::allocator<WriteMeta>>>>,std::less<int>,std::allocator<std::pair<int_const,std::deque<WriteMeta,std::allocator<WriteMeta>>>>>
        ::_M_emplace_unique<std::pair<int_const,std::deque<WriteMeta,std::allocator<WriteMeta>>>&>
                  (local_58,__args);
LAB_0010582e:
        cVar18._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar24._M_node);
LAB_00105839:
        std::
        _Rb_tree<int,_std::pair<const_int,_std::deque<WriteMeta,_std::allocator<WriteMeta>_>_>,_std::_Select1st<std::pair<const_int,_std::deque<WriteMeta,_std::allocator<WriteMeta>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::deque<WriteMeta,_std::allocator<WriteMeta>_>_>_>_>
        ::_M_erase_aux((_Rb_tree<int,_std::pair<const_int,_std::deque<WriteMeta,_std::allocator<WriteMeta>_>_>,_std::_Select1st<std::pair<const_int,_std::deque<WriteMeta,_std::allocator<WriteMeta>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::deque<WriteMeta,_std::allocator<WriteMeta>_>_>_>_>
                        *)local_60,cVar24);
      }
      else if (WVar14 == OK) {
        p_Var21 = (this->closeWhenWriteFinish)._M_t._M_impl.super__Rb_tree_header._M_header.
                  _M_parent;
        p_Var17 = &p_Var4->_M_header;
        if (p_Var21 != (_Base_ptr)0x0) {
          do {
            if (__args->first <= (int)*(size_t *)(p_Var21 + 1)) {
              p_Var17 = p_Var21;
            }
            p_Var21 = (&p_Var21->_M_left)[(int)*(size_t *)(p_Var21 + 1) < __args->first];
          } while (p_Var21 != (_Base_ptr)0x0);
        }
        p_Var22 = p_Var4;
        if (((_Rb_tree_header *)p_Var17 != p_Var4) &&
           (p_Var22 = (_Rb_tree_header *)p_Var17,
           __args->first < (int)((_Rb_tree_header *)p_Var17)->_M_node_count)) {
          p_Var22 = p_Var4;
        }
        if ((p_Var22 == p_Var4) &&
           ((this->onCanWriteHandler).super__Function_base._M_manager != (_Manager_type)0x0)) {
          local_80._0_8_ =
               std::
               map<int,_TcpConnection,_std::less<int>,_std::allocator<std::pair<const_int,_TcpConnection>_>_>
               ::operator[]((map<int,_TcpConnection,_std::less<int>,_std::allocator<std::pair<const_int,_TcpConnection>_>_>
                             *)local_48,(key_type *)__args);
          local_40 = this->data;
          pmVar15 = (mapped_type *)p_Var2;
          if ((this->onCanWriteHandler).super__Function_base._M_manager == (_Manager_type)0x0) {
LAB_00105895:
            uVar19 = std::__throw_bad_function_call();
            if ((mapped_type *)local_80._0_8_ != pmVar15) {
              operator_delete((void *)local_80._0_8_,local_80._16_8_ + 1);
            }
            _Unwind_Resume(uVar19);
          }
          (*(this->onCanWriteHandler)._M_invoker)
                    ((_Any_data *)&this->onCanWriteHandler,(TcpConnection **)local_80,&local_40);
        }
        p_Var21 = cVar24._M_node[3]._M_left;
        p_Var17 = cVar24._M_node[2]._M_left;
        p_Var7 = cVar24._M_node[2]._M_parent;
        p_Var8 = cVar24._M_node[2]._M_right;
        lVar9 = *(long *)(cVar24._M_node + 3);
        p_Var10 = cVar24._M_node[1]._M_right;
        cVar18._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar24._M_node);
        if (((long)p_Var7 - (long)p_Var10 >> 5) +
            ((long)p_Var8 - lVar9 >> 5) +
            ((((ulong)((long)p_Var21 - (long)p_Var17) >> 3) - 1) +
            (ulong)(p_Var21 == (_Base_ptr)0x0)) * 0x10 == 0) goto LAB_00105839;
      }
      else {
        cVar18._M_node = cVar24._M_node;
        if (WVar14 == DeleteConnection) {
          closeConnection(this,__args->first);
          goto LAB_0010582e;
        }
      }
      cVar24._M_node = cVar18._M_node;
    } while ((_Rb_tree_header *)cVar24._M_node != p_Var2);
  } while( true );
}

Assistant:

void daemonRun() {
    struct epoll_event *toHandleEvents;
    toHandleEvents = new struct epoll_event[1024];
    assert(toHandleEvents);
    for (;;) {
      int epollRet = -1;
      if (toWriteContents.empty()) {
        // 没有需要写的，阻塞等待
        epollRet = epoll_wait(epollFd, toHandleEvents, 1024, -1);
      } else {
        epollRet = epoll_wait(epollFd, toHandleEvents, 1024,
                              0);  // 立刻返回，用于write
      }
      if (epollRet < 0) {
        recordError(__FILE__, __LINE__);
        Log(logger, Logger::LOG_ERROR, errorString);
      } else {
        for (int i = 0; i < epollRet; ++i) {
          printEvent(toHandleEvents[i].data.fd, toHandleEvents[i].events);
          // 监听的serverFd
          if (toHandleEvents[i].data.fd == serverFd) {
            if (toHandleEvents[i].events & EPOLLIN) {
              if (!acceptNewConnection()) {
                recordError(__FILE__, __LINE__);
                Log(logger, Logger::LOG_ERROR, errorString);
              }
            }
          } else if (toHandleEvents[i].data.fd == pipeFds[0]) {
            // 调用者通知管道fd
            if (toHandleEvents[i].events & EPOLLIN) {
              handleNotify();
            }
          } else {
            // 处理客户端的连接
            int fd = toHandleEvents[i].data.fd;
            if (connections.find(fd) == connections.end()) {
              Log(logger, Logger::LOG_ERROR, "fd not seen before");
              continue;
            }
            if (toHandleEvents[i].events & EPOLLIN ||
                toHandleEvents[i].events & EPOLLHUP) {
              char *buffer = nullptr;
              buffer = new char[BUFFER_SIZE];
              assert(buffer);
              ssize_t number = -1;
              while ((number = read(fd, buffer, BUFFER_SIZE)) > 0) {
                if (onReadHandler) {
                  auto c = connections[fd];
                  onReadHandler(&(connections[fd]), buffer, number, data);
                }
              }
              if (number < 0) {
                if (errno == EAGAIN) {
                } else {
                  recordError(__FILE__, __LINE__);
                  Log(logger, Logger::LOG_ERROR, errorString);
                }
              } else if (number == 0) {
                // 对端关闭了连接，通知调用者
                // closeConnection(fd);
                if (onPeerShutdownHandler) {
                  onPeerShutdownHandler(&(connections[fd]), data);
                }
                // 删除write队列中的数据
                toWriteContents.erase(fd);
                inActiveWriteContents.erase(fd);
              }
              delete[] buffer;
            } else if (toHandleEvents[i].events & EPOLLOUT) {
              auto index = inActiveWriteContents.find(fd);
              if (index != inActiveWriteContents.end()) {
                toWriteContents.insert(*index);
                inActiveWriteContents.erase(index);
                onCanWriteHandler(&connections[fd], data);
              }
            }
          }
        }
        // 处理write
        for (auto index = toWriteContents.begin();
             index != toWriteContents.end();) {
          WriteContentResult result = writeContent(index->first);
          if (result == WriteContentResult::DeleteConnection) {
            // 关闭连接
            closeConnection(index->first);
            // 删除要写的数据
            index = toWriteContents.erase(index);
          } else if (result == WriteContentResult::Move_to_Inactive) {
            inActiveWriteContents.insert(*index);
            index = toWriteContents.erase(index);
          } else if (result == WriteContentResult::OK) {
            if (closeWhenWriteFinish.find(index->first) ==
                closeWhenWriteFinish.cend()) {
              if (onCanWriteHandler) {
                onCanWriteHandler(&(connections[index->first]), data);
              }
            }
            if (index->second.size() == 0) {
              index = toWriteContents.erase(index);
            } else {
              ++index;
            }
          }
        }
      }
    }
  }